

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O2

pool_ptr<soul::heart::Variable> __thiscall
soul::Module::StateVariables::find(StateVariables *this,string_view name)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  pool_ref<soul::heart::Variable> *ppVar4;
  char *in_RCX;
  long lVar5;
  string_view other;
  
  lVar1 = *(long *)name._M_len;
  lVar2 = ((long *)name._M_len)[1];
  lVar5 = 0;
  do {
    if (lVar2 << 3 == lVar5) {
      ppVar4 = (pool_ref<soul::heart::Variable> *)0x0;
LAB_001e8ed2:
      (this->stateVariables).items = ppVar4;
      return (pool_ptr<soul::heart::Variable>)(Variable *)this;
    }
    other._M_str = in_RCX;
    other._M_len = (size_t)name._M_str;
    bVar3 = Identifier::operator==((Identifier *)(*(long *)(lVar1 + lVar5) + 0x30),other);
    if (bVar3) {
      ppVar4 = *(pool_ref<soul::heart::Variable> **)(lVar1 + lVar5);
      goto LAB_001e8ed2;
    }
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

pool_ptr<heart::Variable> Module::StateVariables::find (std::string_view name) const
{
    for (auto& v : stateVariables)
        if (v->name == name)
            return v;

    return {};
}